

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromOffset
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint64_t Offset)

{
  DWARFSection *Section;
  Optional<llvm::object::SectionedAddress> BaseAddr;
  Optional<llvm::object::SectionedAddress> BaseAddr_00;
  DWARFDataExtractor Data;
  bool bVar1;
  uint8_t AddressSize;
  uint16_t uVar2;
  DWARFObject *Obj;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *pDVar3;
  reference this_00;
  error_code EC;
  error_code local_168;
  Error local_158;
  undefined1 local_150 [8];
  Optional<llvm::object::SectionedAddress> local_148;
  DWARFAddressRangesVector local_130;
  undefined8 local_118;
  char *pcStack_110;
  size_t local_108;
  uint8_t uStack_100;
  uint8_t uStack_ff;
  undefined6 uStack_fe;
  DWARFObject *local_f8;
  undefined1 local_e8 [8];
  Expected<llvm::DWARFDebugRnglist> RangeListOrError;
  DWARFDataExtractor RangesData;
  undefined8 uStack_98;
  undefined8 local_90;
  DWARFAddressRangesVector local_88;
  uint local_6c;
  Error local_68 [3];
  undefined1 local_50 [8];
  Error E;
  DWARFDebugRangeList RangeList;
  uint64_t Offset_local;
  DWARFUnit *this_local;
  
  uVar2 = getVersion(this);
  if (uVar2 < 5) {
    DWARFDebugRangeList::DWARFDebugRangeList((DWARFDebugRangeList *)&E);
    extractRangeList((DWARFUnit *)local_50,(uint64_t)this,(DWARFDebugRangeList *)Offset);
    bVar1 = Error::operator_cast_to_bool((Error *)local_50);
    if (bVar1) {
      Error::Error(local_68,(Error *)local_50);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,local_68);
      Error::~Error(local_68);
    }
    local_6c = (uint)bVar1;
    Error::~Error((Error *)local_50);
    if (local_6c == 0) {
      getBaseAddress((Optional<llvm::object::SectionedAddress> *)&RangesData.Section,this);
      BaseAddr.Storage.field_0.value.SectionIndex = uStack_98;
      BaseAddr.Storage.field_0.value.Address = (uint64_t)RangesData.Section;
      BaseAddr.Storage._16_8_ = local_90;
      DWARFDebugRangeList::getAbsoluteRanges(&local_88,(DWARFDebugRangeList *)&E,BaseAddr);
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  *)__return_storage_ptr__,&local_88,(type *)0x0);
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
                (&local_88);
      local_6c = 1;
    }
    DWARFDebugRangeList::~DWARFDebugRangeList((DWARFDebugRangeList *)&E);
  }
  else {
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this->RngListTable);
    if (bVar1) {
      Obj = DWARFContext::getDWARFObj(this->Context);
      Section = this->RangeSection;
      bVar1 = this->isLittleEndian;
      pDVar3 = &Optional<llvm::DWARFDebugRnglistTable>::operator->(&this->RngListTable)->
                super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
      AddressSize = DWARFListTableBase<llvm::DWARFDebugRnglist>::getAddrSize(pDVar3);
      DWARFDataExtractor::DWARFDataExtractor
                ((DWARFDataExtractor *)&RangeListOrError.field_0x18,Obj,Section,(bool)(bVar1 & 1),
                 AddressSize);
      pDVar3 = &Optional<llvm::DWARFDebugRnglistTable>::operator->(&this->RngListTable)->
                super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
      local_f8 = RangesData.Obj;
      local_108 = RangesData.super_DataExtractor.Data.Length;
      uStack_100 = RangesData.super_DataExtractor.IsLittleEndian;
      uStack_ff = RangesData.super_DataExtractor.AddressSize;
      uStack_fe = RangesData.super_DataExtractor._18_6_;
      local_118 = RangeListOrError._24_8_;
      pcStack_110 = RangesData.super_DataExtractor.Data.Data;
      Data.super_DataExtractor.Data.Length = (size_t)RangesData.super_DataExtractor.Data.Data;
      Data.super_DataExtractor.Data.Data = (char *)RangeListOrError._24_8_;
      Data.super_DataExtractor.IsLittleEndian =
           (undefined1)RangesData.super_DataExtractor.Data.Length;
      Data.super_DataExtractor.AddressSize = RangesData.super_DataExtractor.Data.Length._1_1_;
      Data.super_DataExtractor._18_6_ = RangesData.super_DataExtractor.Data.Length._2_6_;
      Data.Obj = (DWARFObject *)RangesData.super_DataExtractor._16_8_;
      Data.Section = (DWARFSection *)RangesData.Obj;
      DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
                ((Expected<llvm::DWARFDebugRnglist> *)local_e8,pDVar3,Data,Offset);
      bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_e8);
      if (bVar1) {
        this_00 = Expected<llvm::DWARFDebugRnglist>::get
                            ((Expected<llvm::DWARFDebugRnglist> *)local_e8);
        getBaseAddress(&local_148,this);
        BaseAddr_00.Storage.field_0.value.SectionIndex =
             local_148.Storage.field_0.value.SectionIndex;
        BaseAddr_00.Storage.field_0.value.Address = local_148.Storage.field_0.value.Address;
        BaseAddr_00.Storage.hasVal = local_148.Storage.hasVal;
        BaseAddr_00.Storage._17_7_ = local_148.Storage._17_7_;
        DWARFDebugRnglist::getAbsoluteRanges(&local_130,this_00,BaseAddr_00,this);
        Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
        Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                    *)__return_storage_ptr__,&local_130,(type *)0x0);
        std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::~vector
                  (&local_130);
      }
      else {
        Expected<llvm::DWARFDebugRnglist>::takeError((Expected<llvm::DWARFDebugRnglist> *)local_150)
        ;
        Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
        Expected(__return_storage_ptr__,(Error *)local_150);
        Error::~Error((Error *)local_150);
      }
      local_6c = 1;
      Expected<llvm::DWARFDebugRnglist>::~Expected((Expected<llvm::DWARFDebugRnglist> *)local_e8);
    }
    else {
      std::error_code::error_code<llvm::errc,void>(&local_168,invalid_argument);
      EC._M_cat._0_4_ = local_168._M_value;
      EC._0_8_ = &local_158;
      EC._M_cat._4_4_ = 0;
      createStringError(EC,(char *)local_168._M_cat);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_158);
      Error::~Error(&local_158);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromOffset(uint64_t Offset) {
  if (getVersion() <= 4) {
    DWARFDebugRangeList RangeList;
    if (Error E = extractRangeList(Offset, RangeList))
      return std::move(E);
    return RangeList.getAbsoluteRanges(getBaseAddress());
  }
  if (RngListTable) {
    DWARFDataExtractor RangesData(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, RngListTable->getAddrSize());
    auto RangeListOrError = RngListTable->findList(RangesData, Offset);
    if (RangeListOrError)
      return RangeListOrError.get().getAbsoluteRanges(getBaseAddress(), *this);
    return RangeListOrError.takeError();
  }

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}